

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learn.cpp
# Opt level: O2

void save(void)

{
  FILE *__stream;
  ulong uVar1;
  int __c;
  int k;
  long lVar2;
  long lVar3;
  int i;
  ulong uVar4;
  long lVar5;
  
  __stream = fopen("learned.txt","w");
  for (uVar4 = 0; uVar1 = (ulong)num_c, (long)uVar4 < (long)uVar1; uVar4 = uVar4 + 1) {
    fprintf(__stream,"%f",
            w0.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
            _M_start[uVar4]);
    __c = 0x2c;
    if (uVar4 == num_c - 1) {
      __c = 10;
    }
    fputc(__c,__stream);
  }
  for (lVar3 = 0; lVar3 < (int)uVar1; lVar3 = lVar3 + 1) {
    fprintf(__stream,"%d\n",
            (ulong)(uint)shapelet_n.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar3]);
    for (lVar5 = 0;
        lVar5 < shapelet_n.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar3]; lVar5 = lVar5 + 1) {
      fprintf(__stream,"%f,%d",
              w.
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[lVar3].
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start[lVar5],
              (ulong)(uint)shapelet_length.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar3].
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar5]);
      for (lVar2 = 0;
          lVar2 < shapelet_length.
                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[lVar3].
                  super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                  _M_start[lVar5]; lVar2 = lVar2 + 1) {
        fprintf(__stream,",%f",
                *(undefined8 *)
                 (*(long *)&shapelet.
                            super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar3].
                            super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[lVar5].
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data + lVar2 * 8));
      }
      fputc(10,__stream);
    }
    uVar1 = (ulong)(uint)num_c;
  }
  fclose(__stream);
  return;
}

Assistant:

void save() {
    FILE *f;
    f = fopen("learned.txt", "w");

    for (int i = 0; i < num_c; ++i) {
        fprintf(f, "%f", w0[i]);
        if (i != num_c - 1) {
            fprintf(f, ",");
        } else {
            fprintf(f, "\n");
        }
    }

    for (int i = 0; i < num_c; ++i) {
        fprintf(f, "%d\n", shapelet_n[i]);
        for (int j = 0; j < shapelet_n[i]; ++j) {
            fprintf(f, "%f,%d", w[i][j], shapelet_length[i][j]);
            for (int k = 0; k < shapelet_length[i][j]; ++k) {
                fprintf(f, ",%f", shapelet[i][j][k]);
            }
            fprintf(f, "\n");
        }
    }

    fclose(f);
}